

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Cube::setupLeftFace(Cube *this)

{
  float local_58;
  float local_54;
  float leftFace [18];
  Cube *this_local;
  
  local_58 = this->x;
  local_54 = this->y;
  leftFace[0] = this->z;
  leftFace[1] = this->x;
  leftFace[2] = this->y + this->h;
  leftFace[3] = this->z;
  leftFace[4] = this->x;
  leftFace[5] = this->y + this->h;
  leftFace[6] = this->z + this->b;
  leftFace[7] = this->x;
  leftFace[8] = this->y;
  leftFace[9] = this->z;
  leftFace[10] = this->x;
  leftFace[0xb] = this->y + this->h;
  leftFace[0xc] = this->z + this->b;
  leftFace[0xd] = this->x;
  leftFace[0xe] = this->y;
  leftFace[0xf] = this->z + this->b;
  leftFace._64_8_ = this;
  arrayCopy(this,&local_58,this->positionData,0x24);
  return;
}

Assistant:

void setupLeftFace() {
        float leftFace[]={
            x,y,z,

            x,y+h,z,
            x,y+h,z+b,
            x,y,z,
            x,y+h,z+b,
            x,y,z+b
        };
        arrayCopy(leftFace,positionData,36);
    }